

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-format.h
# Opt level: O2

string * wabt::StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  size_type __n;
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args_copy;
  va_list args;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_139;
  undefined8 local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined8 local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  _Vector_base<char,_std::allocator<char>_> local_100;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_128 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_118 = 0x3000000010;
  local_130 = &stack0x00000008;
  local_138 = 0x3000000010;
  local_110 = local_130;
  local_108 = local_128;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,format,&local_118);
  __n = (long)iVar1 + 1;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_100,__n,&local_139);
  vsnprintf(local_100._M_impl.super__Vector_impl_data._M_start,__n,format,&local_138);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_100._M_impl.super__Vector_impl_data._M_start,
             local_100._M_impl.super__Vector_impl_data._M_start + iVar1);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_100);
  return __return_storage_ptr__;
}

Assistant:

StringPrintf(const char* format, ...) {
  va_list args;
  va_list args_copy;
  va_start(args, format);
  va_copy(args_copy, args);
  size_t len = wabt_vsnprintf(nullptr, 0, format, args) + 1;  // For \0.
  std::vector<char> buffer(len);
  va_end(args);
  wabt_vsnprintf(buffer.data(), len, format, args_copy);
  va_end(args_copy);
  return std::string(buffer.data(), len - 1);
}